

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_A.cpp
# Opt level: O2

void __thiscall A::A(A *this,int n)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  this->n_ = n;
  uVar9 = (ulong)(uint)(n * n) << 2;
  pfVar3 = (float *)operator_new__(uVar9);
  this->a = pfVar3;
  pfVar3 = (float *)operator_new__(uVar9);
  this->b = pfVar3;
  pfVar3 = (float *)operator_new__(uVar9);
  this->c = pfVar3;
  spin_mutex_t::lock(&my_io_mutex);
  poVar4 = std::operator<<((ostream *)&std::cerr,"Building A of sz=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->n_);
  std::endl<char,std::char_traits<char>>(poVar4);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < this->n_; lVar6 = lVar6 + 1) {
    pfVar3 = this->c;
    pfVar1 = this->a;
    pfVar2 = this->b;
    iVar7 = 0;
    for (lVar8 = 0; lVar8 < this->n_; lVar8 = lVar8 + 1) {
      *(undefined4 *)((long)pfVar3 + lVar8 * 4 + lVar5) = 0;
      *(float *)((long)pfVar1 + lVar8 * 4 + lVar5) = (float)((int)lVar6 + (int)lVar8);
      *(float *)((long)pfVar2 + lVar8 * 4 + lVar5) = (float)(iVar7 + (int)lVar6);
      iVar7 = iVar7 + -1;
    }
    lVar5 = lVar5 + (long)n * 4;
  }
  return;
}

Assistant:

A(int n)
  : n_(n), a(new float[n *n ]), b(new float[n *n ]), c(new float[n *n ])
  {
    LOG("Building A of sz=" << n_);
    
    for(int i = 0; i < n_; i++)
      for(int j = 0; j < n_; j++) {
        c[i*n+j] = 0;
        a[i*n+j] = i + j;
        b[i*n+j] = i - j;
      }
    
  }